

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

void nni_chunk_free(nni_chunk *ch)

{
  nni_chunk *ch_local;
  
  if ((ch->ch_cap != 0) && (ch->ch_buf != (uint8_t *)0x0)) {
    nni_free(ch->ch_buf,ch->ch_cap);
  }
  ch->ch_ptr = (uint8_t *)0x0;
  ch->ch_buf = (uint8_t *)0x0;
  ch->ch_len = 0;
  ch->ch_cap = 0;
  return;
}

Assistant:

static void
nni_chunk_free(nni_chunk *ch)
{
	if ((ch->ch_cap != 0) && (ch->ch_buf != NULL)) {
		nni_free(ch->ch_buf, ch->ch_cap);
	}
	ch->ch_ptr = NULL;
	ch->ch_buf = NULL;
	ch->ch_len = 0;
	ch->ch_cap = 0;
}